

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O0

void __thiscall L10_1::Stock::show(Stock *this)

{
  fmtflags __fmtfl;
  streamsize __prec;
  ostream *poVar1;
  streamsize precision;
  fmtflags origin_flag;
  Stock *this_local;
  
  __fmtfl = std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
                                _S_fixed,_S_floatfield);
  __prec = std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3)
  ;
  poVar1 = std::operator<<((ostream *)&std::cout,"Company: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," Shares: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->shares);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout," Shares Price: $");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->share_val);
  poVar1 = std::operator<<(poVar1," Total worth: $");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->total_val);
  std::operator<<(poVar1,'\n');
  std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),__fmtfl,
                      _S_floatfield);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),__prec);
  return;
}

Assistant:

void Stock::show() {
    //  设置输出格式
    //  使用定点表示法，避免科学记数法
    std::ios_base::fmtflags origin_flag = std::cout.setf(std::ios_base::fixed, std::ios_base::floatfield);
    std::streamsize precision = std::cout.precision(3);

    std::cout << "Company: " << company << " Shares: " << shares << "\n";
    std::cout << " Shares Price: $" << share_val << " Total worth: $" << total_val << '\n';

    //  恢复之前设置的输出格式
    std::cout.setf(origin_flag, std::ios_base::floatfield);
    std::cout.precision(precision);
}